

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__bmp_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  int iVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  int *in_RCX;
  int *in_RDX;
  int iVar9;
  int iVar10;
  int *in_RSI;
  int *in_RDI;
  int in_R8D;
  stbi_uc *p2;
  stbi_uc *p1;
  stbi_uc t;
  uint a_1;
  stbi__uint32 v_2;
  int bpp;
  uchar a;
  int easy;
  int z_1;
  int acount;
  int bcount;
  int gcount;
  int rcount;
  int ashift;
  int bshift;
  int gshift;
  int rshift;
  int v2;
  int v_1;
  int color;
  int v;
  int bit_offset;
  int z;
  stbi__bmp_data info;
  int target;
  int pad;
  int flip_vertically;
  int width;
  int j;
  int i;
  int psize;
  stbi_uc pal [256] [4];
  uint all_a;
  uint ma;
  uint mb;
  uint mg;
  uint mr;
  stbi_uc *out;
  uint in_stack_fffffffffffffaf8;
  stbi__uint32 in_stack_fffffffffffffafc;
  uint in_stack_fffffffffffffb00;
  uint in_stack_fffffffffffffb04;
  stbi__context *in_stack_fffffffffffffb08;
  uint in_stack_fffffffffffffb28;
  uint in_stack_fffffffffffffb2c;
  int in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  uint local_4ac;
  uint local_4a8;
  uint local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  uint local_488;
  uint local_484;
  uint local_480;
  uint local_47c;
  int local_474;
  int local_464;
  int local_460;
  int local_45c;
  stbi_uc asStack_458 [1028];
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uchar *local_40;
  int local_2c;
  int *local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  uchar *local_8;
  
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_45c = 0;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pvVar7 = stbi__bmp_parse_header
                     (in_stack_fffffffffffffb08,
                      (stbi__bmp_data *)
                      CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  if (pvVar7 == (void *)0x0) {
    local_8 = (uchar *)0x0;
  }
  else {
    iVar2 = local_10[1];
    iVar5 = local_10[1];
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    local_10[1] = iVar5;
    local_44 = local_488;
    local_48 = local_484;
    local_4c = local_480;
    local_50 = local_47c;
    local_54 = 0xff;
    if (local_48c == 0xc) {
      if (local_494 < 0x18) {
        local_45c = (local_490 + -0x26) / 3;
      }
    }
    else if (local_494 < 0x10) {
      local_45c = (local_490 + -0xe) - local_48c >> 2;
    }
    if ((local_494 == 0x18) && (local_47c == 0xff000000)) {
      local_10[2] = 3;
    }
    else {
      iVar5 = 3;
      if (local_47c != 0) {
        iVar5 = 4;
      }
      local_10[2] = iVar5;
    }
    if ((local_2c == 0) || (local_2c < 3)) {
      local_474 = local_10[2];
    }
    else {
      local_474 = local_2c;
    }
    iVar5 = stbi__mad3sizes_valid
                      (in_stack_fffffffffffffb04,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc
                       ,in_stack_fffffffffffffaf8);
    if (iVar5 == 0) {
      stbi__err("too large");
      local_8 = (uchar *)0x0;
    }
    else {
      local_40 = (uchar *)stbi__malloc_mad3(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8,0,
                                            0x286f03);
      if (local_40 == (uchar *)0x0) {
        stbi__err("outofmem");
        local_8 = (uchar *)0x0;
      }
      else {
        if (local_494 < 0x10) {
          local_498 = 0;
          if ((local_45c == 0) || (0x100 < local_45c)) {
            free(local_40);
            stbi__err("invalid");
            return (void *)0x0;
          }
          for (local_460 = 0; local_460 < local_45c; local_460 = local_460 + 1) {
            sVar3 = stbi__get8((stbi__context *)
                               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
            asStack_458[(long)local_460 * 4 + 2] = sVar3;
            sVar3 = stbi__get8((stbi__context *)
                               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
            asStack_458[(long)local_460 * 4 + 1] = sVar3;
            sVar3 = stbi__get8((stbi__context *)
                               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
            asStack_458[(long)local_460 * 4] = sVar3;
            if (local_48c != 0xc) {
              stbi__get8((stbi__context *)
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
            }
            asStack_458[(long)local_460 * 4 + 3] = 0xff;
          }
          stbi__skip((stbi__context *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     in_stack_fffffffffffffafc);
          if (((local_494 != 1) && (local_494 != 4)) && (local_494 != 8)) {
            free(local_40);
            stbi__err("bad bpp");
            return (void *)0x0;
          }
          if (local_494 == 1) {
            for (local_464 = 0; local_464 < local_10[1]; local_464 = local_464 + 1) {
              local_49c = 7;
              bVar4 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
              local_4a0 = (uint)bVar4;
              for (local_460 = 0; local_460 < *local_10; local_460 = local_460 + 1) {
                uVar6 = (int)local_4a0 >> ((byte)local_49c & 0x1f) & 1;
                local_40[local_498] = asStack_458[(long)(int)uVar6 * 4];
                local_40[local_498 + 1] = asStack_458[(long)(int)uVar6 * 4 + 1];
                local_40[local_498 + 2] = asStack_458[(long)(int)uVar6 * 4 + 2];
                iVar5 = local_498 + 3;
                if (local_474 == 4) {
                  local_40[local_498 + 3] = 0xff;
                  iVar5 = local_498 + 4;
                }
                local_498 = iVar5;
                if (local_460 + 1 == *local_10) break;
                local_49c = local_49c + -1;
                if (local_49c < 0) {
                  local_49c = 7;
                  bVar4 = stbi__get8((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                  local_4a0 = (uint)bVar4;
                }
              }
              stbi__skip((stbi__context *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         in_stack_fffffffffffffafc);
            }
          }
          else {
            for (local_464 = 0; local_464 < local_10[1]; local_464 = local_464 + 1) {
              for (local_460 = 0; local_460 < *local_10; local_460 = local_460 + 2) {
                bVar4 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                local_4a8 = (uint)bVar4;
                local_4ac = 0;
                if (local_494 == 4) {
                  local_4ac = local_4a8 & 0xf;
                  local_4a8 = (int)local_4a8 >> 4;
                }
                local_40[local_498] = asStack_458[(long)(int)local_4a8 * 4];
                local_40[local_498 + 1] = asStack_458[(long)(int)local_4a8 * 4 + 1];
                local_40[local_498 + 2] = asStack_458[(long)(int)local_4a8 * 4 + 2];
                iVar5 = local_498 + 3;
                if (local_474 == 4) {
                  local_40[local_498 + 3] = 0xff;
                  iVar5 = local_498 + 4;
                }
                local_498 = iVar5;
                if (local_460 + 1 == *local_10) break;
                if (local_494 == 8) {
                  bVar4 = stbi__get8((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                  local_4ac = (uint)bVar4;
                }
                local_40[local_498] = asStack_458[(long)(int)local_4ac * 4];
                local_40[local_498 + 1] = asStack_458[(long)(int)local_4ac * 4 + 1];
                local_40[local_498 + 2] = asStack_458[(long)(int)local_4ac * 4 + 2];
                iVar5 = local_498 + 3;
                if (local_474 == 4) {
                  local_40[local_498 + 3] = 0xff;
                  iVar5 = local_498 + 4;
                }
                local_498 = iVar5;
                in_stack_fffffffffffffb04 = local_4ac;
              }
              stbi__skip((stbi__context *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         in_stack_fffffffffffffafc);
            }
          }
        }
        else {
          in_stack_fffffffffffffb3c = 0;
          in_stack_fffffffffffffb38 = 0;
          in_stack_fffffffffffffb34 = 0;
          in_stack_fffffffffffffb30 = 0;
          in_stack_fffffffffffffb2c = 0;
          stbi__skip((stbi__context *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     in_stack_fffffffffffffafc);
          if (local_494 == 0x18) {
            in_stack_fffffffffffffb2c = 1;
          }
          else if ((((local_494 == 0x20) && (local_4c == 0xff)) && (local_48 == 0xff00)) &&
                  ((local_44 == 0xff0000 && (local_50 == 0xff000000)))) {
            in_stack_fffffffffffffb2c = 2;
          }
          if (in_stack_fffffffffffffb2c == 0) {
            if (((local_44 == 0) || (local_48 == 0)) || (local_4c == 0)) {
              free(local_40);
              stbi__err("bad masks");
              return (void *)0x0;
            }
            stbi__high_bit(local_44);
            stbi__bitcount(local_44);
            stbi__high_bit(local_48);
            in_stack_fffffffffffffb3c = stbi__bitcount(local_48);
            stbi__high_bit(local_4c);
            in_stack_fffffffffffffb38 = stbi__bitcount(local_4c);
            stbi__high_bit(local_50);
            in_stack_fffffffffffffb34 = stbi__bitcount(local_50);
          }
          for (local_464 = 0; local_464 < local_10[1]; local_464 = local_464 + 1) {
            if (in_stack_fffffffffffffb2c == 0) {
              for (local_460 = 0; local_460 < *local_10; local_460 = local_460 + 1) {
                if (local_494 == 0x10) {
                  in_stack_fffffffffffffafc =
                       stbi__get16le((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
                }
                else {
                  in_stack_fffffffffffffafc =
                       stbi__get32le((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
                }
                iVar5 = stbi__shiftsigned(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00,
                                          in_stack_fffffffffffffafc);
                iVar9 = in_stack_fffffffffffffb30 + 1;
                local_40[in_stack_fffffffffffffb30] = (uchar)iVar5;
                iVar5 = stbi__shiftsigned(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00,
                                          in_stack_fffffffffffffafc);
                iVar10 = iVar9 + 1;
                local_40[iVar9] = (uchar)iVar5;
                iVar5 = stbi__shiftsigned(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00,
                                          in_stack_fffffffffffffafc);
                iVar9 = iVar10 + 1;
                local_40[iVar10] = (uchar)iVar5;
                if (local_50 == 0) {
                  in_stack_fffffffffffffaf8 = 0xff;
                }
                else {
                  in_stack_fffffffffffffaf8 =
                       stbi__shiftsigned(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00,
                                         in_stack_fffffffffffffafc);
                }
                local_54 = in_stack_fffffffffffffaf8 | local_54;
                in_stack_fffffffffffffb30 = iVar9;
                if (local_474 == 4) {
                  in_stack_fffffffffffffb30 = iVar9 + 1;
                  local_40[iVar9] = (uchar)in_stack_fffffffffffffaf8;
                }
              }
            }
            else {
              for (local_460 = 0; local_460 < *local_10; local_460 = local_460 + 1) {
                sVar3 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                local_40[in_stack_fffffffffffffb30 + 2] = sVar3;
                sVar3 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                local_40[in_stack_fffffffffffffb30 + 1] = sVar3;
                sVar3 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                local_40[in_stack_fffffffffffffb30] = sVar3;
                iVar5 = in_stack_fffffffffffffb30 + 3;
                if (in_stack_fffffffffffffb2c == 2) {
                  bVar4 = stbi__get8((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
                  in_stack_fffffffffffffb00 = (uint)bVar4;
                }
                else {
                  in_stack_fffffffffffffb00 = 0xff;
                }
                in_stack_fffffffffffffb28 =
                     CONCAT13((uchar)in_stack_fffffffffffffb00,(int3)in_stack_fffffffffffffb28);
                local_54 = in_stack_fffffffffffffb00 | local_54;
                in_stack_fffffffffffffb30 = iVar5;
                if (local_474 == 4) {
                  in_stack_fffffffffffffb30 = iVar5 + 1;
                  local_40[iVar5] = (uchar)in_stack_fffffffffffffb00;
                }
              }
            }
            stbi__skip((stbi__context *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       in_stack_fffffffffffffafc);
          }
        }
        if ((local_474 == 4) && (local_54 == 0)) {
          for (local_460 = *local_10 * 4 * local_10[1] + -1; -1 < local_460;
              local_460 = local_460 + -4) {
            local_40[local_460] = 0xff;
          }
        }
        if (0 < iVar2) {
          for (local_464 = 0; local_464 < local_10[1] >> 1; local_464 = local_464 + 1) {
            uVar6 = local_464 * *local_10 * local_474;
            uVar8 = ((local_10[1] + -1) - local_464) * *local_10 * local_474;
            for (local_460 = 0; local_460 < *local_10 * local_474; local_460 = local_460 + 1) {
              uVar1 = local_40[(long)local_460 + (ulong)uVar6];
              local_40[(long)local_460 + (ulong)uVar6] = local_40[(long)local_460 + (ulong)uVar8];
              local_40[(long)local_460 + (ulong)uVar8] = uVar1;
            }
          }
        }
        if (((local_2c == 0) || (local_2c == local_474)) ||
           (local_40 = stbi__convert_format
                                 ((uchar *)CONCAT44(in_stack_fffffffffffffb3c,
                                                    in_stack_fffffffffffffb38),
                                  in_stack_fffffffffffffb34,in_stack_fffffffffffffb30,
                                  in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
           local_8 = local_40, local_40 != (uchar *)0x0)) {
          *local_18 = *local_10;
          *local_20 = local_10[1];
          if (local_28 != (int *)0x0) {
            *local_28 = local_10[2];
          }
          local_8 = local_40;
        }
      }
    }
  }
  return local_8;
}

Assistant:

static void *stbi__bmp_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   unsigned int mr=0,mg=0,mb=0,ma=0, all_a;
   stbi_uc pal[256][4];
   int psize=0,i,j,width;
   int flip_vertically, pad, target;
   stbi__bmp_data info;
   STBI_NOTUSED(ri);

   info.all_a = 255;
   if (stbi__bmp_parse_header(s, &info) == NULL)
      return NULL; // error code already set

   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);

   mr = info.mr;
   mg = info.mg;
   mb = info.mb;
   ma = info.ma;
   all_a = info.all_a;

   if (info.hsz == 12) {
      if (info.bpp < 24)
         psize = (info.offset - 14 - 24) / 3;
   } else {
      if (info.bpp < 16)
         psize = (info.offset - 14 - info.hsz) >> 2;
   }

   if (info.bpp == 24 && ma == 0xff000000)
      s->img_n = 3;
   else
      s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert

   // sanity-check size
   if (!stbi__mad3sizes_valid(target, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "Corrupt BMP");

   out = (stbi_uc *) stbi__malloc_mad3(target, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (info.bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { STBI_FREE(out); return stbi__errpuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = stbi__get8(s);
         pal[i][1] = stbi__get8(s);
         pal[i][0] = stbi__get8(s);
         if (info.hsz != 12) stbi__get8(s);
         pal[i][3] = 255;
      }
      stbi__skip(s, info.offset - 14 - info.hsz - psize * (info.hsz == 12 ? 3 : 4));
      if (info.bpp == 1) width = (s->img_x + 7) >> 3;
      else if (info.bpp == 4) width = (s->img_x + 1) >> 1;
      else if (info.bpp == 8) width = s->img_x;
      else { STBI_FREE(out); return stbi__errpuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      if (info.bpp == 1) {
         for (j=0; j < (int) s->img_y; ++j) {
            int bit_offset = 7, v = stbi__get8(s);
            for (i=0; i < (int) s->img_x; ++i) {
               int color = (v>>bit_offset)&0x1;
               out[z++] = pal[color][0];
               out[z++] = pal[color][1];
               out[z++] = pal[color][2];
               if (target == 4) out[z++] = 255;
               if (i+1 == (int) s->img_x) break;
               if((--bit_offset) < 0) {
                  bit_offset = 7;
                  v = stbi__get8(s);
               }
            }
            stbi__skip(s, pad);
         }
      } else {
         for (j=0; j < (int) s->img_y; ++j) {
            for (i=0; i < (int) s->img_x; i += 2) {
               int v=stbi__get8(s),v2=0;
               if (info.bpp == 4) {
                  v2 = v & 15;
                  v >>= 4;
               }
               out[z++] = pal[v][0];
               out[z++] = pal[v][1];
               out[z++] = pal[v][2];
               if (target == 4) out[z++] = 255;
               if (i+1 == (int) s->img_x) break;
               v = (info.bpp == 8) ? stbi__get8(s) : v2;
               out[z++] = pal[v][0];
               out[z++] = pal[v][1];
               out[z++] = pal[v][2];
               if (target == 4) out[z++] = 255;
            }
            stbi__skip(s, pad);
         }
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      stbi__skip(s, info.offset - 14 - info.hsz);
      if (info.bpp == 24) width = 3 * s->img_x;
      else if (info.bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (info.bpp == 24) {
         easy = 1;
      } else if (info.bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0x00ff0000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) { STBI_FREE(out); return stbi__errpuc("bad masks", "Corrupt BMP"); }
         // right shift amt to put high bit in position #7
         rshift = stbi__high_bit(mr)-7; rcount = stbi__bitcount(mr);
         gshift = stbi__high_bit(mg)-7; gcount = stbi__bitcount(mg);
         bshift = stbi__high_bit(mb)-7; bcount = stbi__bitcount(mb);
         ashift = stbi__high_bit(ma)-7; acount = stbi__bitcount(ma);
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               unsigned char a;
               out[z+2] = stbi__get8(s);
               out[z+1] = stbi__get8(s);
               out[z+0] = stbi__get8(s);
               z += 3;
               a = (easy == 2 ? stbi__get8(s) : 255);
               all_a |= a;
               if (target == 4) out[z++] = a;
            }
         } else {
            int bpp = info.bpp;
            for (i=0; i < (int) s->img_x; ++i) {
               stbi__uint32 v = (bpp == 16 ? (stbi__uint32) stbi__get16le(s) : stbi__get32le(s));
               unsigned int a;
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mr, rshift, rcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mg, gshift, gcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mb, bshift, bcount));
               a = (ma ? stbi__shiftsigned(v & ma, ashift, acount) : 255);
               all_a |= a;
               if (target == 4) out[z++] = STBI__BYTECAST(a);
            }
         }
         stbi__skip(s, pad);
      }
   }

   // if alpha channel is all 0s, replace with all 255s
   if (target == 4 && all_a == 0)
      for (i=4*s->img_x*s->img_y-1; i >= 0; i -= 4)
         out[i] = 255;

   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i]; p1[i] = p2[i]; p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = stbi__convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;
   return out;
}